

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall
ON_LineCurve::Split(ON_LineCurve *this,double t,ON_Curve **left_side,ON_Curve **right_side)

{
  int iVar1;
  double t0_00;
  double t_00;
  byte bVar2;
  bool bVar3;
  ON_LineCurve *local_e8;
  ON_LineCurve *right_line;
  ON_LineCurve *left_line;
  ON_3dPoint local_d0;
  undefined1 auStack_a8 [8];
  ON_Line right;
  ON_Line left;
  double t1;
  double t0;
  int dim;
  bool rc;
  ON_Curve **right_side_local;
  ON_Curve **left_side_local;
  double t_local;
  ON_LineCurve *this_local;
  
  bVar2 = 0;
  bVar3 = ON_Interval::Includes(&this->m_t,t,true);
  if (bVar3) {
    iVar1 = this->m_dim;
    t0_00 = ON_Interval::operator[](&this->m_t,0);
    left.to.z = ON_Interval::operator[](&this->m_t,1);
    ON_Line::ON_Line((ON_Line *)&right.to.z);
    ON_Line::ON_Line((ON_Line *)auStack_a8);
    left.from.y = (this->m_line).from.z;
    right.to.z = (this->m_line).from.x;
    left.from.x = (this->m_line).from.y;
    t_00 = ON_Interval::NormalizedParameterAt(&this->m_t,t);
    ON_Line::PointAt(&local_d0,&this->m_line,t_00);
    left.to.y = local_d0.z;
    left.from.z = local_d0.x;
    left.to.x = local_d0.y;
    right.from.y = local_d0.z;
    auStack_a8 = (undefined1  [8])local_d0.x;
    right.from.x = local_d0.y;
    right.to.y = (this->m_line).to.z;
    right.from.z = (this->m_line).to.x;
    right.to.x = (this->m_line).to.y;
    bVar3 = ON_3dPoint::IsCoincident((ON_3dPoint *)&right.to.z,(ON_3dPoint *)&left.from.z);
    if ((bVar3) ||
       (bVar3 = ON_3dPoint::IsCoincident((ON_3dPoint *)auStack_a8,(ON_3dPoint *)&right.from.z),
       bVar3)) {
      this_local._7_1_ = 0;
      bVar3 = true;
    }
    else {
      right_line = Cast((ON_Object *)*left_side);
      local_e8 = Cast((ON_Object *)*right_side);
      if ((*left_side == (ON_Curve *)0x0) || (right_line != (ON_LineCurve *)0x0)) {
        if ((*right_side == (ON_Curve *)0x0) || (local_e8 != (ON_LineCurve *)0x0)) {
          if (right_line == (ON_LineCurve *)0x0) {
            right_line = (ON_LineCurve *)operator_new(0x58);
            ON_LineCurve(right_line);
            *left_side = (ON_Curve *)right_line;
          }
          if (local_e8 == (ON_LineCurve *)0x0) {
            local_e8 = (ON_LineCurve *)operator_new(0x58);
            ON_LineCurve(local_e8);
            *right_side = (ON_Curve *)local_e8;
          }
          ON_Curve::DestroyCurveTree(&right_line->super_ON_Curve);
          (right_line->m_line).to.y = left.to.x;
          (right_line->m_line).to.z = left.to.y;
          (right_line->m_line).from.z = left.from.y;
          (right_line->m_line).to.x = left.from.z;
          (right_line->m_line).from.x = right.to.z;
          (right_line->m_line).from.y = left.from.x;
          ON_Interval::Set(&right_line->m_t,t0_00,t);
          right_line->m_dim = iVar1;
          ON_Curve::DestroyCurveTree(&local_e8->super_ON_Curve);
          (local_e8->m_line).to.y = right.to.x;
          (local_e8->m_line).to.z = right.to.y;
          (local_e8->m_line).from.z = right.from.y;
          (local_e8->m_line).to.x = right.from.z;
          (local_e8->m_line).from.x = (double)auStack_a8;
          (local_e8->m_line).from.y = right.from.x;
          ON_Interval::Set(&local_e8->m_t,t,left.to.z);
          local_e8->m_dim = iVar1;
          bVar2 = 1;
          bVar3 = false;
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linecurve.cpp"
                     ,0x27d,"","ON_LineCurve::Split - input right_side not an ON_LineCurve*");
          this_local._7_1_ = 0;
          bVar3 = true;
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linecurve.cpp"
                   ,0x278,"","ON_LineCurve::Split - input left_side not an ON_LineCurve*");
        this_local._7_1_ = 0;
        bVar3 = true;
      }
    }
    ON_Line::~ON_Line((ON_Line *)auStack_a8);
    ON_Line::~ON_Line((ON_Line *)&right.to.z);
    if (bVar3) goto LAB_006ae109;
  }
  this_local._7_1_ = bVar2;
LAB_006ae109:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_LineCurve::Split( 
      double t,
      ON_Curve*& left_side,
      ON_Curve*& right_side
    ) const

{
  bool rc = false;
  if ( m_t.Includes(t,true) )
  {
    const int dim = m_dim;
    double t0 = m_t[0];
    double t1 = m_t[1];
    ON_Line left, right;
    left.from = m_line.from;
    left.to = m_line.PointAt(m_t.NormalizedParameterAt(t));
    right.from = left.to;
    right.to = m_line.to;

		// 27 March 2003, Greg Arden.  Result must pass IsValid()
    // Fixes RH-64018
    // 6 May 21, GBA, changed ON_LineCurve::IsValid and so this was updated
		if( left.from.IsCoincident(left.to) || right.from.IsCoincident(right.to) )
			return false;

    ON_LineCurve* left_line = ON_LineCurve::Cast(left_side);
    ON_LineCurve* right_line = ON_LineCurve::Cast(right_side);
    if ( left_side && !left_line )
    {
      ON_ERROR("ON_LineCurve::Split - input left_side not an ON_LineCurve*");
      return false;
    }
    if ( right_side && !right_line )
    {
      ON_ERROR("ON_LineCurve::Split - input right_side not an ON_LineCurve*");
      return false;
    }
    if ( !left_line )
    {
      left_line = new ON_LineCurve();
      left_side = left_line;
    }
    if ( !right_line )
    {
      right_line = new ON_LineCurve();
      right_side = right_line;
    }

    left_line->DestroyCurveTree();
    left_line->m_line = left;
    left_line->m_t.Set( t0, t );
    left_line->m_dim = dim;

    right_line->DestroyCurveTree();
    right_line->m_line = right;
    right_line->m_t.Set( t, t1 );
    right_line->m_dim = dim;

    rc = true;
  }
  return rc;
}